

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O3

WordTagger * __thiscall
CoreML::Specification::CoreMLModels::WordTagger::New(WordTagger *this,Arena *arena)

{
  WordTagger *this_00;
  
  this_00 = (WordTagger *)operator_new(0x58);
  WordTagger(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CoreMLModels::WordTagger>(arena,this_00);
  }
  return this_00;
}

Assistant:

WordTagger* WordTagger::New(::google::protobuf::Arena* arena) const {
  WordTagger* n = new WordTagger;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}